

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O3

void pzshape::TPZShapePrism::ShapeCorner
               (TPZVec<double> *pt,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double *pdVar1;
  long lVar2;
  double *pdVar3;
  
  pdVar1 = pt->fStore;
  lVar2 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar2 < 1) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar3 = phi->fElem;
  *pdVar3 = (1.0 - pdVar1[2]) * ((1.0 - *pdVar1) - pdVar1[1]) * 0.5;
  if ((lVar2 < 2) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar3[1] = (1.0 - pdVar1[2]) * *pdVar1 * 0.5;
  if ((lVar2 < 3) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar3[2] = (1.0 - pdVar1[2]) * pdVar1[1] * 0.5;
  if ((lVar2 < 4) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar3[3] = (pdVar1[2] + 1.0) * ((1.0 - *pdVar1) - pdVar1[1]) * 0.5;
  if ((lVar2 < 5) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar3[4] = (pdVar1[2] + 1.0) * *pdVar1 * 0.5;
  if ((lVar2 < 6) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar3[5] = (pdVar1[2] + 1.0) * pdVar1[1] * 0.5;
  lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar2 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar3 = dphi->fElem;
  *pdVar3 = (1.0 - pdVar1[2]) * -0.5;
  if ((lVar2 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar3[1] = (1.0 - pdVar1[2]) * -0.5;
  if ((lVar2 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar3[2] = ((1.0 - *pdVar1) - pdVar1[1]) * -0.5;
  if ((lVar2 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar3[lVar2] = (1.0 - pdVar1[2]) * 0.5;
  if ((lVar2 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar3[lVar2 + 1] = 0.0;
  if ((lVar2 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar3[lVar2 + 2] = *pt->fStore * -0.5;
  if ((lVar2 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar3[lVar2 * 2] = 0.0;
  pdVar1 = pt->fStore;
  if ((lVar2 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar3[lVar2 * 2 + 1] = (1.0 - pdVar1[2]) * 0.5;
  if ((lVar2 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar3[lVar2 * 2 + 2] = pdVar1[1] * -0.5;
  if ((0 < lVar2) && (3 < (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
    pdVar3[lVar2 * 3] = (pdVar1[2] + 1.0) * -0.5;
    if ((lVar2 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 * 3 + 1] = (pdVar1[2] + 1.0) * -0.5;
    if ((lVar2 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 * 3 + 2] = ((1.0 - *pdVar1) - pdVar1[1]) * 0.5;
    if ((lVar2 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 * 4] = (pdVar1[2] + 1.0) * 0.5;
    if ((lVar2 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 * 4 + 1] = 0.0;
    if ((lVar2 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 * 4 + 2] = *pt->fStore * 0.5;
    if ((lVar2 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 6)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 * 5] = 0.0;
    pdVar1 = pt->fStore;
    if ((lVar2 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 6)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pdVar3[lVar2 * 5 + 1] = (pdVar1[2] + 1.0) * 0.5;
    if ((2 < lVar2) && (5 < (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
      pdVar3[lVar2 * 5 + 2] = pdVar1[1] * 0.5;
      return;
    }
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZShapePrism::ShapeCorner(const TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
        phi(0,0)  = .5*(1.-pt[0]-pt[1])*(1.-pt[2]);
        phi(1,0)  = .5*pt[0]*(1.-pt[2]);
        phi(2,0)  = .5*pt[1]*(1.-pt[2]);
        phi(3,0)  = .5*(1.-pt[0]-pt[1])*(1.+pt[2]);
        phi(4,0)  = .5*pt[0]*(1.+pt[2]);
        phi(5,0)  = .5*pt[1]*(1.+pt[2]);
        
        dphi(0,0) = -.5*(1.-pt[2]);
        dphi(1,0) = -.5*(1.-pt[2]);
        dphi(2,0) = -.5*(1.-pt[0]-pt[1]);
        
        dphi(0,1) =  .5*(1.-pt[2]);
        dphi(1,1) =  .0;
        dphi(2,1) = -.5*pt[0];
        
        dphi(0,2) =  .0;
        dphi(1,2) =  .5*(1.-pt[2]);
        dphi(2,2) = -.5*pt[1];
        
        dphi(0,3) = -.5*(1.+pt[2]);
        dphi(1,3) = -.5*(1.+pt[2]);
        dphi(2,3) =  .5*(1.-pt[0]-pt[1]);
        
        dphi(0,4) =  .5*(1.+pt[2]);
        dphi(1,4) =  .0;
        dphi(2,4) =  .5*pt[0];
        
        dphi(0,5) =  .0;
        dphi(1,5) =  .5*(1.+pt[2]);
        dphi(2,5) =  .5*pt[1];
    }